

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int IDASetIncrementFactorB(void *ida_mem,int which,sunrealtype dqincfacB)

{
  int iVar1;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem local_20;
  IDALsMemB local_18;
  IDAMem local_10;
  IDAadjMem local_8;
  
  iVar1 = idaLs_AccessLMemB(ida_mem,which,"IDASetIncrementFactorB",&local_10,&local_8,&local_20,
                            &local_18);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = IDASetIncrementFactor(local_20->IDA_mem,dqincfacB);
  return iVar1;
}

Assistant:

int IDASetIncrementFactorB(void* ida_mem, int which, sunrealtype dqincfacB)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  void* ida_memB;
  int retval;

  /* access relevant memory structures */
  retval = idaLs_AccessLMemB(ida_mem, which, "IDASetIncrementFactorB", &IDA_mem,
                             &IDAADJ_mem, &IDAB_mem, &idalsB_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call corresponding routine for IDAB_mem structure */
  ida_memB = (void*)IDAB_mem->IDA_mem;
  return (IDASetIncrementFactor(ida_memB, dqincfacB));
}